

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_result ma_data_source_set_loop_point_in_pcm_frames
                    (ma_data_source *pDataSource,ma_uint64 loopBegInFrames,ma_uint64 loopEndInFrames
                    )

{
  ma_result mVar1;
  ulong uVar2;
  
  mVar1 = MA_INVALID_ARGS;
  if ((loopBegInFrames <= loopEndInFrames && pDataSource != (ma_data_source *)0x0) &&
     (loopEndInFrames == 0xffffffffffffffff ||
      loopEndInFrames <= *(ulong *)((long)pDataSource + 0x10))) {
    uVar2 = *(ulong *)((long)pDataSource + 0x10) - *(long *)((long)pDataSource + 8);
    if (loopEndInFrames <= uVar2) {
      uVar2 = loopEndInFrames;
    }
    *(ma_uint64 *)((long)pDataSource + 0x18) = loopBegInFrames;
    if (loopEndInFrames == 0xffffffffffffffff) {
      uVar2 = loopEndInFrames;
    }
    *(ulong *)((long)pDataSource + 0x20) = uVar2;
    mVar1 = MA_SUCCESS;
  }
  return mVar1;
}

Assistant:

MA_API ma_result ma_data_source_set_loop_point_in_pcm_frames(ma_data_source* pDataSource, ma_uint64 loopBegInFrames, ma_uint64 loopEndInFrames)
{
    ma_data_source_base* pDataSourceBase = (ma_data_source_base*)pDataSource;

    if (pDataSource == NULL) {
        return MA_INVALID_ARGS;
    }

    if (loopEndInFrames < loopBegInFrames) {
        return MA_INVALID_ARGS; /* The end of the loop point must come after the beginning. */
    }

    if (loopEndInFrames > pDataSourceBase->rangeEndInFrames && loopEndInFrames != ~((ma_uint64)0)) {
        return MA_INVALID_ARGS; /* The end of the loop point must not go beyond the range. */
    }

    pDataSourceBase->loopBegInFrames = loopBegInFrames;
    pDataSourceBase->loopEndInFrames = loopEndInFrames;

    /* The end cannot exceed the range. */
    if (pDataSourceBase->loopEndInFrames > (pDataSourceBase->rangeEndInFrames - pDataSourceBase->rangeBegInFrames) && pDataSourceBase->loopEndInFrames != ~((ma_uint64)0)) {
        pDataSourceBase->loopEndInFrames = (pDataSourceBase->rangeEndInFrames - pDataSourceBase->rangeBegInFrames);
    }

    return MA_SUCCESS;
}